

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::resetText(CharScanner *this)

{
  LexerInputState *pLVar1;
  
  std::__cxx11::string::assign((char *)&this->text);
  pLVar1 = ((this->inputState).ref)->ptr;
  pLVar1->tokenStartColumn = pLVar1->column;
  pLVar1->tokenStartLine = pLVar1->line;
  return;
}

Assistant:

virtual void resetText()
	{
		text = "";
		inputState->tokenStartColumn = inputState->column;
		inputState->tokenStartLine = inputState->line;
	}